

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::addInstruction
          (Builder *this,unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  Block *pBVar1;
  bool bVar2;
  Op OVar3;
  Id IVar4;
  pointer pIVar5;
  reference pvVar6;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_80;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_78;
  undefined4 local_6c;
  Op local_68;
  Id local_64;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60;
  __single_object lineInst_1;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_48;
  __single_object lineInst;
  Op local_30;
  Id local_2c;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_28;
  __single_object scopeInst;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst_local;
  Builder *this_local;
  
  pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (inst);
  OVar3 = spv::Instruction::getOpCode(pIVar5);
  if (OVar3 == OpPhi) {
    pBVar1 = this->buildPoint;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&scopeInst,inst);
    Block::addInstruction(pBVar1,&scopeInst);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&scopeInst);
  }
  else {
    if (((this->emitNonSemanticShaderDebugInfo & 1U) != 0) && ((this->dirtyScopeTracker & 1U) != 0))
    {
      pBVar1 = this->buildPoint;
      pvVar6 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
               top(&this->currentDebugScopeId);
      bVar2 = Block::updateDebugScope(pBVar1,*pvVar6);
      if (bVar2) {
        local_2c = getUniqueId(this);
        local_30 = makeVoidType(this);
        std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
                  ((uint *)&local_28,&local_2c,&local_30);
        pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                 operator->(&local_28);
        spv::Instruction::reserveOperands(pIVar5,3);
        pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                 operator->(&local_28);
        spv::Instruction::addIdOperand(pIVar5,this->nonSemanticShaderDebugInfo);
        pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                 operator->(&local_28);
        spv::Instruction::addImmediateOperand(pIVar5,0x17);
        pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                 operator->(&local_28);
        pvVar6 = std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::top(&this->currentDebugScopeId);
        spv::Instruction::addIdOperand(pIVar5,*pvVar6);
        pBVar1 = this->buildPoint;
        std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                  (&lineInst,&local_28);
        Block::addInstruction(pBVar1,&lineInst);
        std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                  (&lineInst);
        std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                  (&local_28);
      }
      this->dirtyScopeTracker = false;
    }
    if (((this->trackDebugInfo & 1U) != 0) && ((this->dirtyLineTracker & 1U) != 0)) {
      bVar2 = Block::updateDebugSourceLocation
                        (this->buildPoint,this->currentLine,0,this->currentFileId);
      if (bVar2) {
        if ((this->emitSpirvDebugInfo & 1U) != 0) {
          std::make_unique<spv::Instruction,spv::Op>((Op *)&local_48);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_48);
          spv::Instruction::reserveOperands(pIVar5,3);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_48);
          spv::Instruction::addIdOperand(pIVar5,this->currentFileId);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_48);
          spv::Instruction::addImmediateOperand(pIVar5,this->currentLine);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_48);
          spv::Instruction::addImmediateOperand(pIVar5,0);
          pBVar1 = this->buildPoint;
          std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                    (&lineInst_1,&local_48);
          Block::addInstruction(pBVar1,&lineInst_1);
          std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                    (&lineInst_1);
          std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                    (&local_48);
        }
        if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
          local_64 = getUniqueId(this);
          local_68 = makeVoidType(this);
          local_6c = 0xc;
          std::make_unique<spv::Instruction,unsigned_int,unsigned_int,spv::Op>
                    ((uint *)&local_60,&local_64,&local_68);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_60);
          spv::Instruction::reserveOperands(pIVar5,7);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_60);
          spv::Instruction::addIdOperand(pIVar5,this->nonSemanticShaderDebugInfo);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_60);
          spv::Instruction::addImmediateOperand(pIVar5,0x67);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_60);
          IVar4 = makeDebugSource(this,this->currentFileId);
          spv::Instruction::addIdOperand(pIVar5,IVar4);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_60);
          IVar4 = makeUintConstant(this,this->currentLine,false);
          spv::Instruction::addIdOperand(pIVar5,IVar4);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_60);
          IVar4 = makeUintConstant(this,this->currentLine,false);
          spv::Instruction::addIdOperand(pIVar5,IVar4);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_60);
          IVar4 = makeUintConstant(this,0,false);
          spv::Instruction::addIdOperand(pIVar5,IVar4);
          pIVar5 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::
                   operator->(&local_60);
          IVar4 = makeUintConstant(this,0,false);
          spv::Instruction::addIdOperand(pIVar5,IVar4);
          pBVar1 = this->buildPoint;
          std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
                    (&local_78,&local_60);
          Block::addInstruction(pBVar1,&local_78);
          std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                    (&local_78);
          std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                    (&local_60);
        }
      }
      this->dirtyLineTracker = false;
    }
    pBVar1 = this->buildPoint;
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
              (&local_80,inst);
    Block::addInstruction(pBVar1,&local_80);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_80);
  }
  return;
}

Assistant:

void Builder::addInstruction(std::unique_ptr<Instruction> inst) {
    // Phis must appear first in their block, don't insert line tracking instructions
    // in front of them, just add the OpPhi and return.
    if (inst->getOpCode() == OpPhi) {
        buildPoint->addInstruction(std::move(inst));
        return;
    }
    // Optionally insert OpDebugScope
    if (emitNonSemanticShaderDebugInfo && dirtyScopeTracker) {
        if (buildPoint->updateDebugScope(currentDebugScopeId.top())) {
            auto scopeInst = std::make_unique<Instruction>(getUniqueId(), makeVoidType(), OpExtInst);
            scopeInst->reserveOperands(3);
            scopeInst->addIdOperand(nonSemanticShaderDebugInfo);
            scopeInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugScope);
            scopeInst->addIdOperand(currentDebugScopeId.top());
            buildPoint->addInstruction(std::move(scopeInst));
        }

        dirtyScopeTracker = false;
    }

    // Insert OpLine/OpDebugLine if the debug source location has changed
    if (trackDebugInfo && dirtyLineTracker) {
        if (buildPoint->updateDebugSourceLocation(currentLine, 0, currentFileId)) {
            if (emitSpirvDebugInfo) {
                auto lineInst = std::make_unique<Instruction>(OpLine);
                lineInst->reserveOperands(3);
                lineInst->addIdOperand(currentFileId);
                lineInst->addImmediateOperand(currentLine);
                lineInst->addImmediateOperand(0);
                buildPoint->addInstruction(std::move(lineInst));
            }
            if (emitNonSemanticShaderDebugInfo) {
                auto lineInst = std::make_unique<Instruction>(getUniqueId(), makeVoidType(), OpExtInst);
                lineInst->reserveOperands(7);
                lineInst->addIdOperand(nonSemanticShaderDebugInfo);
                lineInst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugLine);
                lineInst->addIdOperand(makeDebugSource(currentFileId));
                lineInst->addIdOperand(makeUintConstant(currentLine));
                lineInst->addIdOperand(makeUintConstant(currentLine));
                lineInst->addIdOperand(makeUintConstant(0));
                lineInst->addIdOperand(makeUintConstant(0));
                buildPoint->addInstruction(std::move(lineInst));
            }
        }

        dirtyLineTracker = false;
    }

    buildPoint->addInstruction(std::move(inst));
}